

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O0

int run_test_poll_oob(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int *piVar2;
  bool bVar3;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_loop_t *loop;
  undefined1 local_20 [4];
  int r;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_20);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xa6,"uv_ip4_addr(\"127.0.0.1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  loop_00 = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_tcp_init(loop_00,&server_handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xa9,"uv_tcp_init(loop, &server_handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_init(loop_00,&client_handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xaa,"uv_tcp_init(loop, &client_handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_init(loop_00,&peer_handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xab,"uv_tcp_init(loop, &peer_handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_idle_init(loop_00,&idle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xac,"uv_idle_init(loop, &idle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_bind(&server_handle,local_20,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xad,"uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_listen(&server_handle,1,connection_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xae,"uv_listen((uv_stream_t*) &server_handle, 1, connection_cb)","==","0",(long)iVar1,
            "==",0);
    abort();
  }
  iVar1 = uv_tcp_nodelay(&client_handle,1);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xb1,"uv_tcp_nodelay(&client_handle, 1)","==","0",(long)iVar1,"==",0);
    abort();
  }
  client_fd = socket(2,1,0);
  if ((long)client_fd < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xb4,"client_fd",">=","0",(long)client_fd,">=",0);
    abort();
  }
  do {
    piVar2 = __errno_location();
    *piVar2 = 0;
    iVar1 = connect(client_fd,(sockaddr *)local_20,0x10);
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xb9,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_run(loop_00,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xbb,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)ticks != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xbd,"ticks","==","kMaxTicks",(long)ticks,"==",10);
    abort();
  }
  if ((long)cli_pr_check != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xc0,"1","==","cli_pr_check",1,"==",(long)cli_pr_check);
    abort();
  }
  if ((long)cli_rd_check != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xc2,"2","==","cli_rd_check",2,"==",(long)cli_rd_check);
    abort();
  }
  if ((long)srv_rd_check != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0xc6,"1","==","srv_rd_check",1,"==",(long)srv_rd_check);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
          ,200,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
  abort();
}

Assistant:

TEST_IMPL(poll_oob) {
  struct sockaddr_in addr;
  int r = 0;
  uv_loop_t* loop;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT_OK(uv_tcp_init(loop, &server_handle));
  ASSERT_OK(uv_tcp_init(loop, &client_handle));
  ASSERT_OK(uv_tcp_init(loop, &peer_handle));
  ASSERT_OK(uv_idle_init(loop, &idle));
  ASSERT_OK(uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT_OK(uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));

  /* Ensure two separate packets */
  ASSERT_OK(uv_tcp_nodelay(&client_handle, 1));

  client_fd = socket(PF_INET, SOCK_STREAM, 0);
  ASSERT_GE(client_fd, 0);
  do {
    errno = 0;
    r = connect(client_fd, (const struct sockaddr*)&addr, sizeof(addr));
  } while (r == -1 && errno == EINTR);
  ASSERT_OK(r);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_EQ(ticks, kMaxTicks);

  /* Did client receive the POLLPRI message */
  ASSERT_EQ(1, cli_pr_check);
  /* Did client receive the POLLIN message */
  ASSERT_EQ(2, cli_rd_check);
  /* Could we write with POLLOUT and did the server receive our POLLOUT message
   * through POLLIN.
   */
  ASSERT_EQ(1, srv_rd_check);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}